

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

SqASTData *
SQCompilation::ParseToAST
          (SQVM *vm,char *sourceText,size_t sourceTextSize,SQChar *sourcename,bool preserveComments,
          bool raiseerror)

{
  byte bVar1;
  uint uVar2;
  Arena *this;
  RootBlock *pRVar3;
  byte bVar4;
  char *in_RCX;
  long in_RDI;
  byte in_R8B;
  byte in_R9B;
  RootBlock *r;
  SqASTData *astData;
  void *commentsPtr;
  Comments *comments;
  Arena *astArena;
  void *arenaPtr;
  undefined1 in_stack_000002f7;
  Comments *in_stack_000002f8;
  SQChar *in_stack_00000300;
  size_t in_stack_00000308;
  char *in_stack_00000310;
  SQVM *in_stack_00000318;
  Arena *in_stack_00000320;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  SQAllocContext in_stack_ffffffffffffff70;
  SQAllocContext local_48;
  undefined6 in_stack_ffffffffffffffd0;
  SqASTData *local_8;
  
  bVar4 = in_R8B & 1;
  bVar1 = in_R9B & 1;
  this = (Arena *)sq_vm_malloc(in_stack_ffffffffffffff70,
                               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  Arena::Arena(this,(SQAllocContext)**(undefined8 **)(in_RDI + 0x128),"AST",0x4000);
  local_48 = (SQAllocContext)0x0;
  if ((bVar4 & 1) != 0) {
    in_stack_ffffffffffffff70 =
         (SQAllocContext)
         sq_vm_malloc(in_stack_ffffffffffffff70,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    Comments::Comments((Comments *)in_stack_ffffffffffffff70,
                       (SQAllocContext)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                      );
    local_48 = in_stack_ffffffffffffff70;
  }
  local_8 = (SqASTData *)
            sq_vm_malloc(in_stack_ffffffffffffff70,
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (in_RCX == (char *)0x0) {
    local_8->sourceName[0] = '\0';
  }
  else {
    strncpy(local_8->sourceName,in_RCX,0x100);
    local_8->sourceName[0xff] = '\0';
  }
  uVar2 = (uint)(bVar1 & 1);
  pRVar3 = parseASTImpl(in_stack_00000320,in_stack_00000318,in_stack_00000310,in_stack_00000308,
                        in_stack_00000300,in_stack_000002f8,(bool)in_stack_000002f7);
  if (pRVar3 == (RootBlock *)0x0) {
    if (local_48 != (SQAllocContext)0x0) {
      Comments::~Comments((Comments *)CONCAT17(bVar4,CONCAT16(bVar1,in_stack_ffffffffffffffd0)));
      sq_vm_free(in_stack_ffffffffffffff70,(void *)CONCAT44(in_stack_ffffffffffffff6c,uVar2),
                 0x14d2dd);
    }
    Arena::~Arena((Arena *)0x14d2e7);
    sq_vm_free(in_stack_ffffffffffffff70,(void *)CONCAT44(in_stack_ffffffffffffff6c,uVar2),0x14d308)
    ;
    sq_vm_free(in_stack_ffffffffffffff70,(void *)CONCAT44(in_stack_ffffffffffffff6c,uVar2),0x14d329)
    ;
    local_8 = (SqASTData *)0x0;
  }
  else {
    local_8->astArena = this;
    local_8->root = pRVar3;
    local_8->comments = (Comments *)local_48;
  }
  return local_8;
}

Assistant:

SqASTData *ParseToAST(SQVM *vm, const char *sourceText, size_t sourceTextSize, const SQChar *sourcename, bool preserveComments, bool raiseerror) {

  void *arenaPtr = sq_vm_malloc(_ss(vm)->_alloc_ctx, sizeof(Arena));
  Arena *astArena = new (arenaPtr) Arena(_ss(vm)->_alloc_ctx, "AST");
  Comments *comments = nullptr;
  if (preserveComments) {
    void *commentsPtr = sq_vm_malloc(_ss(vm)->_alloc_ctx, sizeof(Comments));
    comments = new (commentsPtr) Comments(_ss(vm)->_alloc_ctx);
  }

  SqASTData *astData = (SqASTData *)sq_vm_malloc(_ss(vm)->_alloc_ctx, sizeof(SqASTData));
  if (sourcename) {
    strncpy(astData->sourceName, sourcename, sizeof(astData->sourceName));
    astData->sourceName[sizeof(astData->sourceName) / sizeof(astData->sourceName[0]) - 1] = 0;
  }
  else
    astData->sourceName[0] = 0;

  RootBlock *r = parseASTImpl(astArena, vm, sourceText, sourceTextSize, astData->sourceName, comments, raiseerror);

  if (!r) {
    if (comments) {
      comments->~Comments();
      sq_vm_free(_ss(vm)->_alloc_ctx, comments, sizeof(Comments));
    }
    astArena->~Arena();
    sq_vm_free(_ss(vm)->_alloc_ctx, astArena, sizeof(Arena));
    sq_vm_free(_ss(vm)->_alloc_ctx, astData, sizeof(SqASTData));
    return nullptr;
  }

  astData->astArena = astArena;
  astData->root = r;
  astData->comments = comments;

  return astData;
}